

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

bool cmFileAPI::ReadRequestVersions
               (Value *version,
               vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
               *versions,string *error)

{
  bool bVar1;
  bool bVar2;
  Value *pVVar3;
  const_iterator cVar4;
  ValueIteratorBase local_48;
  SelfType local_38;
  
  bVar1 = Json::Value::isArray(version);
  if (bVar1) {
    cVar4 = Json::Value::begin(version);
    local_48.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
    local_48.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
    cVar4 = Json::Value::end(version);
    local_38.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
    local_38.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
    bVar1 = Json::ValueIteratorBase::isEqual(&local_48,&local_38);
    if (!bVar1) {
      pVVar3 = Json::ValueIteratorBase::deref(&local_48);
      bVar2 = ReadRequestVersion(pVVar3,true,versions,error);
      if (bVar2) {
        do {
          Json::ValueIteratorBase::increment(&local_48);
          bVar1 = Json::ValueIteratorBase::isEqual(&local_48,&local_38);
          if (bVar1) {
            return true;
          }
          pVVar3 = Json::ValueIteratorBase::deref(&local_48);
          bVar2 = ReadRequestVersion(pVVar3,true,versions,error);
        } while (bVar2);
      }
      if (bVar1 == false) {
        return false;
      }
    }
  }
  else {
    bVar1 = ReadRequestVersion(version,false,versions,error);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool cmFileAPI::ReadRequestVersions(Json::Value const& version,
                                    std::vector<RequestVersion>& versions,
                                    std::string& error)
{
  if (version.isArray()) {
    for (Json::Value const& v : version) {
      if (!ReadRequestVersion(v, /*inArray=*/true, versions, error)) {
        return false;
      }
    }
  } else {
    if (!ReadRequestVersion(version, /*inArray=*/false, versions, error)) {
      return false;
    }
  }
  return true;
}